

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int on_ack_max_data(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent
                   )

{
  if (acked == 0) {
    quicly_maxsender_lost
              ((quicly_maxsender_t *)&map[-6].bytes_in_flight,
               (quicly_maxsender_sent_t *)&(sent->data).packet);
  }
  else {
    quicly_maxsender_acked
              ((quicly_maxsender_t *)&map[-6].bytes_in_flight,
               (quicly_maxsender_sent_t *)&(sent->data).packet);
  }
  return 0;
}

Assistant:

static int on_ack_max_data(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));

    if (acked) {
        quicly_maxsender_acked(&conn->ingress.max_data.sender, &sent->data.max_data.args);
    } else {
        quicly_maxsender_lost(&conn->ingress.max_data.sender, &sent->data.max_data.args);
    }

    return 0;
}